

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  byte bVar1;
  char *pPtr;
  long lVar2;
  long lVar3;
  
  if ((pIdList != (IdList *)0x0) && (0 < pIdList->nId)) {
    lVar3 = 0;
    do {
      pPtr = pIdList->a[lVar3].zName;
      if (pPtr == (char *)0x0) {
        if (zOld == (char *)0x0) {
LAB_0019bdfc:
          renameTokenFind(pParse,pCtx,pPtr);
        }
      }
      else if (zOld != (char *)0x0) {
        lVar2 = 0;
        do {
          bVar1 = pPtr[lVar2];
          if (bVar1 == zOld[lVar2]) {
            if ((ulong)bVar1 == 0) goto LAB_0019bdfc;
          }
          else if (""[bVar1] != ""[(byte)zOld[lVar2]]) break;
          lVar2 = lVar2 + 1;
        } while( true );
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pIdList->nId);
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const IdList *pIdList,
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      const char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}